

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O3

void __thiscall
hungarian_algorithm::
BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
::doSolve(BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
          *this,size_t row,CombinedCost *accumulated_cost)

{
  ulong *puVar1;
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  *pmVar2;
  size_type i;
  const_reference pdVar3;
  ulong uVar4;
  _Bit_type *p_Var5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  CombinedCost new_accumulated_cost;
  CombinedCost local_40;
  
  uVar7 = this->num_rows_;
  if (row < uVar7) {
    uVar4 = this->num_cols_;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      p_Var5 = (this->covered_cols_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar7 = 0;
      do {
        uVar6 = uVar7 + 0x3f;
        if (-1 < (long)uVar7) {
          uVar6 = uVar7;
        }
        lVar8 = (long)uVar6 >> 6;
        uVar6 = (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001);
        uVar9 = 1L << ((byte)uVar7 & 0x3f);
        if ((p_Var5[lVar8 + uVar6 + 0xffffffffffffffff] >> (uVar7 & 0x3f) & 1) == 0) {
          pmVar2 = this->cost_function_;
          i = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                        (row,pmVar2->size1_,uVar7,pmVar2->size2_);
          pdVar3 = boost::numeric::ublas::
                   unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                   ::operator[](&pmVar2->data_,i);
          local_40.second.rep_ = pdVar3->rep_ + (accumulated_cost->second).rep_;
          local_40.first = accumulated_cost->first;
          (this->current_assignment_).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[row] = uVar7;
          puVar1 = (this->covered_cols_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   lVar8 + uVar6 + 0xffffffffffffffff;
          *puVar1 = *puVar1 | uVar9;
          doSolve(this,row + 1,&local_40);
          p_Var5 = (this->covered_cols_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          p_Var5[lVar8 + uVar6 + 0xffffffffffffffff] =
               p_Var5[lVar8 + uVar6 + 0xffffffffffffffff] & ~uVar9;
          uVar4 = this->num_cols_;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar4);
      uVar7 = this->num_rows_;
    }
    if (uVar4 < uVar7) {
      local_40.first = accumulated_cost->first + 1;
      local_40.second.rep_ = (accumulated_cost->second).rep_;
      (this->current_assignment_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[row] = uVar4;
      doSolve(this,row + 1,&local_40);
    }
  }
  else {
    uVar7 = (this->optimal_cost_).first;
    if ((accumulated_cost->first < uVar7) ||
       ((accumulated_cost->first == uVar7 &&
        ((this->optimal_cost_).second.rep_ < (accumulated_cost->second).rep_)))) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&this->optimal_assignment_,&this->current_assignment_);
      (this->optimal_cost_).first = accumulated_cost->first;
      if (&this->optimal_cost_ != accumulated_cost) {
        (this->optimal_cost_).second.rep_ = (accumulated_cost->second).rep_;
      }
    }
  }
  return;
}

Assistant:

void doSolve(const std::size_t row, const CombinedCost& accumulated_cost)
  {
    if (row < num_rows_)
    {
      for (std::size_t col = 0; col < num_cols_; ++col)
      {
        if (!covered_cols_[col])
        {
          const CombinedCost new_accumulated_cost(accumulated_cost.first,
                                                  accumulated_cost.second + cost_function_(Size(row), Size(col)));
          current_assignment_[row] = col;
          covered_cols_[col] = true;
          doSolve(row + 1, new_accumulated_cost);
          covered_cols_[col] = false;
        }
      }

      if (num_cols_ < num_rows_)
      {
        // One possibility is also an invalid assignment:
        const CombinedCost new_accumulated_cost(accumulated_cost.first + 1, accumulated_cost.second);
        current_assignment_[static_cast<std::size_t>(row)] = num_cols_;
        doSolve(row + 1, new_accumulated_cost);
      }
    }
    else if (isBetterThan(accumulated_cost, optimal_cost_))
    {
      optimal_assignment_ = current_assignment_;
      optimal_cost_ = accumulated_cost;
    }
  }